

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int avx512_array_container_to_uint32_array
              (void *vout,uint16_t *array,size_t cardinality,uint32_t base)

{
  int iVar1;
  long lVar2;
  uint32_t *out;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  
  if (cardinality < 0x10) {
    uVar3 = 0;
    iVar1 = 0;
  }
  else {
    auVar6 = vpbroadcastd_avx512f();
    lVar2 = 0;
    uVar4 = 0;
    do {
      auVar7 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(array + uVar4));
      auVar7 = vpaddd_avx512f(auVar6,auVar7);
      auVar7 = vmovdqu64_avx512f(auVar7);
      *(undefined1 (*) [64])((long)vout + (lVar2 >> 0x1e)) = auVar7;
      uVar3 = uVar4 + 0x10;
      uVar5 = uVar4 + 0x20;
      lVar2 = lVar2 + 0x1000000000;
      uVar4 = uVar3;
    } while (uVar5 <= cardinality);
    iVar1 = (int)uVar3;
  }
  if (uVar3 < cardinality) {
    lVar2 = 0;
    do {
      *(uint *)((long)vout + lVar2 * 4 + (long)iVar1 * 4) = array[uVar3 + lVar2] + base;
      lVar2 = lVar2 + 1;
    } while (cardinality - uVar3 != lVar2);
    iVar1 = iVar1 + (int)lVar2;
  }
  return iVar1;
}

Assistant:

int avx512_array_container_to_uint32_array(void *vout, const uint16_t *array,
                                           size_t cardinality, uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i + sizeof(__m256i) / sizeof(uint16_t) <= cardinality;
         i += sizeof(__m256i) / sizeof(uint16_t)) {
        __m256i vinput = _mm256_loadu_si256((const __m256i *)(array + i));
        __m512i voutput = _mm512_add_epi32(_mm512_cvtepu16_epi32(vinput),
                                           _mm512_set1_epi32(base));
        _mm512_storeu_si512((__m512i *)(out + outpos), voutput);
        outpos += sizeof(__m512i) / sizeof(uint32_t);
    }
    for (; i < cardinality; ++i) {
        const uint32_t val = base + array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}